

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O0

void __thiscall
jaegertracing::propagation::BinaryPropagator::inject
          (BinaryPropagator *this,SpanContext *ctx,ostream *out)

{
  bool bVar1;
  uint uVar2;
  TraceID *pTVar3;
  uint64_t uVar4;
  StrMap *pSVar5;
  size_type sVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  value_type *pair;
  const_iterator __end2;
  const_iterator __begin2;
  StrMap *__range2;
  ostream *out_local;
  SpanContext *ctx_local;
  BinaryPropagator *this_local;
  
  pTVar3 = SpanContext::traceID(ctx);
  uVar4 = TraceID::high(pTVar3);
  writeBinary<unsigned_long>(out,uVar4);
  pTVar3 = SpanContext::traceID(ctx);
  uVar4 = TraceID::low(pTVar3);
  writeBinary<unsigned_long>(out,uVar4);
  uVar4 = SpanContext::spanID(ctx);
  writeBinary<unsigned_long>(out,uVar4);
  uVar4 = SpanContext::parentID(ctx);
  writeBinary<unsigned_long>(out,uVar4);
  SpanContext::flags(ctx);
  std::ostream::put((char)out);
  pSVar5 = SpanContext::baggage_abi_cxx11_(ctx);
  sVar6 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(pSVar5);
  writeBinary<unsigned_int>(out,(uint)sVar6);
  pSVar5 = SpanContext::baggage_abi_cxx11_(ctx);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(pSVar5);
  pair = (value_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(pSVar5);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         *)&pair);
    if (!bVar1) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::operator*(&__end2);
    uVar2 = std::__cxx11::string::size();
    writeBinary<unsigned_int>(out,uVar2);
    lVar7 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write((char *)out,lVar7);
    uVar2 = std::__cxx11::string::size();
    writeBinary<unsigned_int>(out,uVar2);
    lVar7 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write((char *)out,lVar7);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void inject(const SpanContext& ctx, std::ostream& out) const override
    {
        writeBinary(out, ctx.traceID().high());
        writeBinary(out, ctx.traceID().low());
        writeBinary(out, ctx.spanID());
        writeBinary(out, ctx.parentID());
        // `flags` is a single byte, so endianness is not an issue.
        out.put(ctx.flags());

        writeBinary(out, static_cast<uint32_t>(ctx.baggage().size()));
        for (auto&& pair : ctx.baggage()) {
            auto&& key = pair.first;
            writeBinary(out, static_cast<uint32_t>(key.size()));
            out.write(key.c_str(), key.size());

            auto&& value = pair.second;
            writeBinary(out, static_cast<uint32_t>(value.size()));
            out.write(value.c_str(), value.size());
        }
    }